

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O3

void __thiscall
wallet::SelectionResult::
InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
          (SelectionResult *this,
          vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs)

{
  pointer psVar1;
  string_view func;
  size_t sVar2;
  runtime_error *this_00;
  size_t sVar3;
  pointer __v;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __v = (inputs->
        super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (inputs->
           super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = ((long)psVar1 - (long)__v >> 4) + sVar2;
  local_58._M_dataplus._M_p = (pointer)this;
  if (psVar1 != __v) {
    do {
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
      ::
      _M_insert_unique_<std::shared_ptr<wallet::COutput>const&,std::_Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>::_Alloc_node>
                ((_Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
                  *)this,(const_iterator)
                         &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header,__v,
                 (_Alloc_node *)&local_58);
      __v = __v + 1;
    } while (__v != psVar1);
    sVar2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (sVar2 == sVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    func._M_str = "InsertInputs";
    func._M_len = 0xc;
    msg._M_str = "Shared UTXOs among selection results";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
    ;
    file._M_len = 0x66;
    StrFormatInternalBug_abi_cxx11_(&local_58,msg,file,0x161,func);
    std::runtime_error::runtime_error(this_00,(string *)&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void InsertInputs(const T& inputs)
    {
        // Store sum of combined input sets to check that the results have no shared UTXOs
        const size_t expected_count = m_selected_inputs.size() + inputs.size();
        util::insert(m_selected_inputs, inputs);
        if (m_selected_inputs.size() != expected_count) {
            throw std::runtime_error(STR_INTERNAL_BUG("Shared UTXOs among selection results"));
        }
    }